

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O2

void TestPreviousDouble(void)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  undefined4 extraout_EDX;
  uint uVar3;
  undefined4 extraout_EDX_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  Double d0;
  Double local_50;
  undefined1 local_48 [16];
  Double d2;
  Double d1;
  
  d0.d64_ = 1;
  dVar2 = double_conversion::Double::PreviousDouble(&d0);
  CheckEqualsHelper((char *)0x1b0,0xc0f3ff,"Double(4e-324).PreviousDouble()",0.0,
                    (char *)CONCAT71(in_register_00000009,in_CL),dVar2);
  d0.d64_ = 0;
  dVar2 = double_conversion::Double::PreviousDouble(&d0);
  CheckEqualsHelper((char *)0x1b1,0xc0f3fe,"Double(0.0).PreviousDouble()",-0.0,
                    (char *)CONCAT71(in_register_00000009,in_CL),dVar2);
  d0.d64_ = 0;
  dVar2 = double_conversion::Double::PreviousDouble(&d0);
  auVar1._8_4_ = extraout_XMM0_Dc;
  auVar1._0_8_ = dVar2;
  auVar1._12_4_ = extraout_XMM0_Dd;
  uVar3 = movmskpd(extraout_EDX,auVar1);
  CheckHelper((char *)0x1b2,0xc1d1f8,(char *)(ulong)(uVar3 & 1),(bool)in_CL);
  d0.d64_ = 0x8000000000000000;
  dVar2 = double_conversion::Double::PreviousDouble(&d0);
  CheckEqualsHelper((char *)0x1b3,0xc1d228,"Double(-0.0).PreviousDouble()",-4.94065645841247e-324,
                    (char *)CONCAT71(in_register_00000009,in_CL),dVar2);
  d0.d64_ = 1;
  d1.d64_ = (uint64_t)double_conversion::Double::PreviousDouble(&d0);
  d2.d64_ = (uint64_t)double_conversion::Double::PreviousDouble(&d1);
  local_48._8_4_ = extraout_XMM0_Dc_00;
  local_48._0_8_ = d2.d64_;
  local_48._12_4_ = extraout_XMM0_Dd_00;
  CheckEqualsHelper((char *)0x1b7,0xc0f3ff,"d1.value()",0.0,
                    (char *)CONCAT71(in_register_00000009,in_CL),(double)d1.d64_);
  CheckHelper((char *)0x1b8,0xc1d24e,(char *)(ulong)(-1 < (long)d1.d64_),(bool)in_CL);
  CheckEqualsHelper((char *)0x1b9,0xc0f3fe,"d2.value()",-0.0,
                    (char *)CONCAT71(in_register_00000009,in_CL),(double)local_48._0_8_);
  uVar3 = movmskpd(extraout_EDX_00,local_48);
  CheckHelper((char *)0x1ba,0xc1d25c,(char *)(ulong)(uVar3 & 1),(bool)in_CL);
  dVar2 = double_conversion::Double::PreviousDouble(&d2);
  CheckEqualsHelper((char *)0x1bb,0xc1d228,"d2.PreviousDouble()",-4.94065645841247e-324,
                    (char *)CONCAT71(in_register_00000009,in_CL),dVar2);
  local_50.d64_ = 0x7ff0000000000000;
  dVar2 = double_conversion::Double::PreviousDouble(&local_50);
  CheckEqualsHelper((char *)0x1bc,0xc1d12f,"Double(Double::Infinity()).PreviousDouble()",
                    1.79769313486232e+308,(char *)CONCAT71(in_register_00000009,in_CL),dVar2);
  local_50.d64_ = 0xffefffffffffffff;
  dVar2 = double_conversion::Double::PreviousDouble(&local_50);
  CheckEqualsHelper((char *)0x1be,0xc16ca6,
                    "Double(DOUBLE_CONVERSION_UINT64_2PART_C(0xffefffff, ffffffff)).PreviousDouble()"
                    ,-INFINITY,(char *)CONCAT71(in_register_00000009,in_CL),dVar2);
  return;
}

Assistant:

TEST(PreviousDouble) {
  CHECK_EQ(0.0, Double(4e-324).PreviousDouble());
  CHECK_EQ(-0.0, Double(0.0).PreviousDouble());
  CHECK(Double(Double(0.0).PreviousDouble()).Sign() < 0);
  CHECK_EQ(-4e-324, Double(-0.0).PreviousDouble());
  Double d0(4e-324);
  Double d1(d0.PreviousDouble());
  Double d2(d1.PreviousDouble());
  CHECK_EQ(0.0, d1.value());
  CHECK(d1.Sign() > 0);
  CHECK_EQ(-0.0, d2.value());
  CHECK(d2.Sign() < 0);
  CHECK_EQ(-4e-324, d2.PreviousDouble());
  CHECK_EQ(1.7976931348623157e308, Double(Double::Infinity()).PreviousDouble());
  CHECK_EQ(-Double::Infinity(),
           Double(DOUBLE_CONVERSION_UINT64_2PART_C(0xffefffff, ffffffff)).PreviousDouble());
}